

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_alpn_to_proto_str(alpn_proto_buf *buf,alpn_spec *spec)

{
  size_t __n;
  bool bVar1;
  long local_38;
  size_t off;
  size_t len;
  size_t i;
  alpn_spec *spec_local;
  alpn_proto_buf *buf_local;
  
  local_38 = 0;
  memset(buf,0,0x28);
  len = 0;
  while( true ) {
    bVar1 = false;
    if (spec != (alpn_spec *)0x0) {
      bVar1 = len < spec->count;
    }
    if (!bVar1) {
      buf->data[local_38] = '\0';
      buf->len = (int)local_38;
      return CURLE_OK;
    }
    __n = strlen(spec->entries[len]);
    if (9 < __n) {
      return CURLE_FAILED_INIT;
    }
    if (0x20 < local_38 + __n + 2) break;
    if (local_38 != 0) {
      buf->data[local_38] = ',';
      local_38 = local_38 + 1;
    }
    memcpy(buf->data + local_38,spec->entries + len,__n);
    local_38 = __n + local_38;
    len = len + 1;
  }
  return CURLE_FAILED_INIT;
}

Assistant:

CURLcode Curl_alpn_to_proto_str(struct alpn_proto_buf *buf,
                                const struct alpn_spec *spec)
{
  size_t i, len;
  size_t off = 0;

  memset(buf, 0, sizeof(*buf));
  for(i = 0; spec && i < spec->count; ++i) {
    len = strlen(spec->entries[i]);
    if(len >= ALPN_NAME_MAX)
      return CURLE_FAILED_INIT;
    if(off + len + 2 >= sizeof(buf->data))
      return CURLE_FAILED_INIT;
    if(off)
      buf->data[off++] = ',';
    memcpy(buf->data + off, spec->entries[i], len);
    off += len;
  }
  buf->data[off] = '\0';
  buf->len = (int)off;
  return CURLE_OK;
}